

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

conncache * Curl_conncache_init(int size)

{
  conncache *pcVar1;
  curl_hash *pcVar2;
  
  pcVar1 = (conncache *)(*Curl_ccalloc)(1,0x28);
  if (pcVar1 != (conncache *)0x0) {
    pcVar2 = Curl_hash_alloc(size,Curl_hash_str,Curl_str_key_compare,free_bundle_hash_entry);
    pcVar1->hash = pcVar2;
    if (pcVar2 != (curl_hash *)0x0) {
      return pcVar1;
    }
    (*Curl_cfree)(pcVar1);
  }
  return (conncache *)0x0;
}

Assistant:

struct conncache *Curl_conncache_init(int size)
{
  struct conncache *connc;

  connc = calloc(1, sizeof(struct conncache));
  if(!connc)
    return NULL;

  connc->hash = Curl_hash_alloc(size, Curl_hash_str,
                                Curl_str_key_compare, free_bundle_hash_entry);

  if(!connc->hash) {
    free(connc);
    return NULL;
  }

  return connc;
}